

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseCrossThreadFulfillerPair<int> * __thiscall
kj::Executor::newPromiseAndCrossThreadFulfiller<int>
          (PromiseCrossThreadFulfillerPair<int> *__return_storage_ptr__,Executor *this)

{
  XThreadPafImpl<int> *this_00;
  Own<kj::_::XThreadPafImpl<int>,_kj::_::PromiseDisposer> *other;
  Own<kj::_::XThreadFulfiller<int>,_std::nullptr_t> *other_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_58;
  undefined1 local_50 [8];
  Own<kj::_::XThreadFulfiller<int>,_std::nullptr_t> fulfiller;
  Own<const_kj::Executor,_std::nullptr_t> local_30;
  Own<kj::_::XThreadPafImpl<int>,_kj::_::PromiseDisposer> local_20;
  Own<kj::_::XThreadPafImpl<int>,_kj::_::PromiseDisposer> node;
  Executor *this_local;
  
  node.ptr = (XThreadPafImpl<int> *)this;
  this_00 = (XThreadPafImpl<int> *)operator_new(0x1e0);
  fulfiller.ptr._3_1_ = 1;
  (**this->_vptr_Executor)(&local_30);
  kj::_::XThreadPafImpl<int>::XThreadPaf(this_00,&local_30);
  fulfiller.ptr._3_1_ = 0;
  Own<kj::_::XThreadPafImpl<int>,_kj::_::PromiseDisposer>::Own(&local_20,this_00);
  Own<const_kj::Executor,_std::nullptr_t>::~Own(&local_30);
  heap<kj::_::XThreadFulfiller<int>,kj::Own<kj::_::XThreadPafImpl<int>,kj::_::PromiseDisposer>&>
            ((kj *)local_50,&local_20);
  other = mv<kj::Own<kj::_::XThreadPafImpl<int>,kj::_::PromiseDisposer>>(&local_20);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::Own<kj::_::XThreadPafImpl<int>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_58,other);
  kj::_::PromiseNode::to<kj::Promise<int>>
            ((PromiseNode *)__return_storage_ptr__,(OwnPromiseNode *)&local_58);
  other_00 = mv<kj::Own<kj::_::XThreadFulfiller<int>,decltype(nullptr)>>
                       ((Own<kj::_::XThreadFulfiller<int>,_std::nullptr_t> *)local_50);
  Own<kj::CrossThreadPromiseFulfiller<int>,decltype(nullptr)>::
  Own<kj::_::XThreadFulfiller<int>,void>
            ((Own<kj::CrossThreadPromiseFulfiller<int>,decltype(nullptr)> *)
             &__return_storage_ptr__->fulfiller,other_00);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_58);
  Own<kj::_::XThreadFulfiller<int>,_std::nullptr_t>::~Own
            ((Own<kj::_::XThreadFulfiller<int>,_std::nullptr_t> *)local_50);
  Own<kj::_::XThreadPafImpl<int>,_kj::_::PromiseDisposer>::~Own(&local_20);
  return __return_storage_ptr__;
}

Assistant:

PromiseCrossThreadFulfillerPair<T> Executor::newPromiseAndCrossThreadFulfiller() const {
  kj::Own<_::XThreadPafImpl<T>, _::PromiseDisposer> node(new _::XThreadPafImpl<T>(addRef()));
  auto fulfiller = kj::heap<_::XThreadFulfiller<T>>(node);
  return { _::PromiseNode::to<_::ReducePromises<T>>(kj::mv(node)), kj::mv(fulfiller) };
}